

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Table::Set(Table *this,Store *store,u32 offset,Ref ref)

{
  bool bVar1;
  reference pvVar2;
  u32 offset_local;
  Store *store_local;
  Table *this_local;
  Ref ref_local;
  
  bVar1 = Store::HasValueType(store,ref,*(ValueType *)&(this->type_).super_ExternType.field_0xc);
  if (!bVar1) {
    __assert_fail("store.HasValueType(ref, type_.element)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                  ,0x1fe,"Result wabt::interp::Table::Set(Store &, u32, Ref)");
  }
  bVar1 = IsValidRange(this,offset,1);
  if (bVar1) {
    pvVar2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->elements_,(ulong)offset);
    pvVar2->index = ref.index;
    Result::Result((Result *)((long)&ref_local.index + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&ref_local.index + 4),Error);
  }
  return (Result)ref_local.index._4_4_;
}

Assistant:

Result Table::Set(Store& store, u32 offset, Ref ref) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, 1)) {
    elements_[offset] = ref;
    return Result::Ok;
  }
  return Result::Error;
}